

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FileDescriptorProto::SharedDtor(FileDescriptorProto *this)

{
  FileDescriptorProto *pFVar1;
  FileDescriptorProto *in_RDI;
  string *default_value;
  ArenaStringPtr *in_stack_ffffffffffffff80;
  ArenaStringPtr *this_00;
  
  default_value = (string *)&in_RDI->name_;
  internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::DestroyNoArena(in_stack_ffffffffffffff80,default_value);
  this_00 = &in_RDI->package_;
  internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::DestroyNoArena(this_00,default_value);
  internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::DestroyNoArena(this_00,default_value);
  pFVar1 = internal_default_instance();
  if ((in_RDI != pFVar1) && (in_RDI->options_ != (FileOptions *)0x0)) {
    (*(in_RDI->options_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pFVar1 = internal_default_instance();
  if ((in_RDI != pFVar1) && (in_RDI->source_code_info_ != (SourceCodeInfo *)0x0)) {
    (*(in_RDI->source_code_info_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  return;
}

Assistant:

void FileDescriptorProto::SharedDtor() {
  GOOGLE_DCHECK(GetArenaNoVirtual() == nullptr);
  name_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  package_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  syntax_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) delete options_;
  if (this != internal_default_instance()) delete source_code_info_;
}